

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

DataType __thiscall adios2::core::Group::InquireVariableType(Group *this,string *name)

{
  DataType DVar1;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_50 [7];
  char in_stack_ffffffffffffffb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc8;
  IO *in_stack_ffffffffffffffd0;
  
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x68);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  DVar1 = IO::InquireVariableType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string(local_50);
  return DVar1;
}

Assistant:

DataType Group::InquireVariableType(const std::string &name) const noexcept
{

    return m_IO.InquireVariableType(currentPath + groupDelimiter + name);
}